

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int png_image_read_colormap(png_voidp argument)

{
  byte bVar1;
  undefined8 *puVar2;
  png_structrp png_ptr;
  byte *pbVar3;
  bool bVar4;
  byte bVar5;
  png_uint_16 pVar6;
  uint uVar7;
  int iVar8;
  png_uint_32 pVar9;
  png_fixed_point pVar10;
  int iVar11;
  int iVar12;
  size_t __n;
  png_uint_32 pVar13;
  uint uVar14;
  png_uint_32 green;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  png_uint_32 pVar19;
  char *pcVar20;
  uint uVar21;
  png_uint_32 blue;
  uint uVar22;
  png_uint_32 alpha;
  png_uint_32 pVar23;
  uint uVar24;
  png_byte *ppVar25;
  ulong uVar26;
  png_bytep ppVar27;
  undefined1 auVar28 [16];
  uint local_98;
  uint local_90;
  int local_80;
  png_color_16 c;
  
  puVar2 = *argument;
  png_ptr = *(png_structrp *)*puVar2;
  uVar14 = *(uint *)((long)puVar2 + 0x14);
  uVar7 = uVar14 & 4;
  lVar18 = 2;
  iVar8 = 2 - (uint)(uVar7 == 0);
  bVar5 = png_ptr->color_type;
  if ((bVar5 & 4) == 0) {
    if (png_ptr->num_trans == 0 || (uVar14 & 1) != 0) goto LAB_0010c2b3;
LAB_0010c2d2:
    uVar16 = 0;
    uVar26 = 0;
    local_98 = 0;
    if (uVar7 == 0) {
      pbVar3 = *(byte **)((long)argument + 0x20);
      if (pbVar3 == (byte *)0x0) {
        pcVar20 = "background color must be supplied to remove alpha/transparency";
        goto LAB_0010d149;
      }
      uVar26 = (ulong)pbVar3[1];
      if ((uVar14 & 2) == 0) {
        uVar16 = (uint)pbVar3[1];
        local_98 = uVar16;
      }
      else {
        local_98 = (uint)*pbVar3;
        uVar16 = (uint)pbVar3[2];
      }
    }
  }
  else {
    if ((uVar14 & 1) == 0) goto LAB_0010c2d2;
LAB_0010c2b3:
    uVar16 = 0xffff;
    if (uVar7 == 0) {
      uVar16 = 0xff;
    }
    uVar26 = (ulong)uVar16;
    local_98 = uVar16;
  }
  local_90 = (uint)uVar26;
  bVar1 = png_ptr->bit_depth;
  if ((bVar1 != 0x10) || (pVar10 = 100000, (*(byte *)(puVar2 + 3) & 4) != 0)) {
    pVar10 = 0xb18f;
  }
  png_ptr->default_gamma = pVar10;
  switch(bVar5) {
  case 0:
    if (bVar1 < 9) {
      pVar9 = 1 << (bVar1 & 0x1f);
      if (*(uint *)((long)puVar2 + 0x1c) < pVar9) {
        pcVar20 = "gray[8] color-map: too few entries";
        goto LAB_0010d149;
      }
      pVar19 = 0;
      if (png_ptr->num_trans == 0) {
        uVar24 = 0x100;
        pVar13 = 0;
      }
      else {
        uVar24 = (uint)(png_ptr->trans_color).gray;
        pVar23 = 0xffff;
        if (uVar7 == 0) {
          pVar23 = 0xff;
        }
        pVar13 = 0;
        if ((uVar14 & 1) == 0) {
          pVar13 = pVar23;
        }
      }
      for (uVar14 = 0; pVar9 != uVar14; uVar14 = uVar14 + 1) {
        pVar23 = local_98;
        green = local_90;
        blue = uVar16;
        uVar7 = uVar24;
        alpha = pVar13;
        iVar11 = iVar8;
        if (uVar24 != uVar14) {
          pVar23 = pVar19;
          green = pVar19;
          blue = pVar19;
          uVar7 = uVar14;
          alpha = 0xff;
          iVar11 = 3;
        }
        png_create_colormap_entry
                  ((png_image_read_control *)argument,uVar7,pVar23,green,blue,alpha,iVar11);
        pVar19 = pVar19 + 0xff / (byte)((char)pVar9 - 1U);
      }
      bVar5 = png_ptr->bit_depth;
      if (7 < bVar5) goto LAB_0010cd8f;
LAB_0010cd75:
      png_set_packing(png_ptr);
      lVar18 = 0;
      goto LAB_0010cf29;
    }
    if (*(uint *)((long)puVar2 + 0x1c) < 0x100) {
      pcVar20 = "gray[16] color-map: too few entries";
      goto LAB_0010d149;
    }
    pVar9 = make_gray_colormap((png_image_read_control *)argument);
    if (png_ptr->num_trans != 0) {
      pVar19 = 0;
      if ((uVar14 & 1) == 0) {
        if ((local_98 == local_90) && (local_90 == uVar16)) {
          uVar14 = uVar16;
          if (uVar7 != 0) {
            uVar14 = uVar16 * 0xff >> 0xf;
            uVar14 = ((uint)png_sRGB_delta[uVar14] * (uVar16 * 0xff & 0x7fff) >> 0xc) +
                     (uint)png_sRGB_base[uVar14] >> 8 & 0xff;
            png_create_colormap_entry
                      ((png_image_read_control *)argument,uVar14,uVar16,uVar16,uVar16,0xffff,2);
          }
          c.index = '\0';
          auVar28 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0);
          c._2_8_ = auVar28._0_8_;
          lVar18 = 0;
          png_set_background_fixed(png_ptr,&c,1,0,0);
          break;
        }
        pVar19 = 0xffff;
        if (uVar7 == 0) {
          pVar19 = 0xff;
        }
      }
      png_create_colormap_entry
                ((png_image_read_control *)argument,0xfe,local_98,local_90,uVar16,pVar19,iVar8);
      local_80 = 1;
      goto LAB_0010ceea;
    }
    lVar18 = 0;
    break;
  default:
    pcVar20 = "invalid PNG color type";
    goto LAB_0010d149;
  case 2:
  case 6:
    if ((uVar14 & 2) == 0) {
      local_80 = 1;
      png_set_rgb_to_gray_fixed(png_ptr,1,-1,-1);
      if (png_ptr->color_type == '\x06') {
        if ((uVar14 & 1) != 0) {
LAB_0010c393:
          if (*(uint *)((long)puVar2 + 0x1c) < 0x100) {
            pcVar20 = "rgb[ga] color-map: too few entries";
            goto LAB_0010d149;
          }
          pVar9 = make_ga_colormap((png_image_read_control *)argument);
          lVar18 = 1;
          goto LAB_0010ceea;
        }
      }
      else if ((uVar14 & 1) != 0 && png_ptr->num_trans != 0) goto LAB_0010c393;
      pVar10 = png_resolve_file_gamma(png_ptr);
      if (*(uint *)((long)puVar2 + 0x1c) < 0x100) {
        pcVar20 = "rgb[gray] color-map: too few entries";
        goto LAB_0010d149;
      }
      if (((png_ptr->color_type == '\x06') || (png_ptr->num_trans != 0)) &&
         (iVar11 = png_gamma_not_sRGB(pVar10), iVar11 != 0)) {
        local_80 = 3;
        for (pVar9 = 0; pVar9 != 0x100; pVar9 = pVar9 + 1) {
          png_create_colormap_entry
                    ((png_image_read_control *)argument,pVar9,pVar9,pVar9,pVar9,0xff,3);
        }
        pVar9 = 0x100;
        bVar4 = true;
      }
      else {
        pVar9 = make_gray_colormap((png_image_read_control *)argument);
        local_80 = 1;
        bVar4 = false;
      }
      if ((png_ptr->color_type == '\x06') || (png_ptr->num_trans != 0)) {
        if (bVar4) {
          pVar19 = local_90;
          if (uVar7 == 0) {
            pVar19 = (png_uint_32)png_sRGB_table[uVar26];
          }
          pVar6 = png_gamma_16bit_correct(pVar19,pVar10);
          pVar19 = (uint)pVar6 * 0xff + 0x807f >> 0x10;
LAB_0010cc80:
          png_create_colormap_entry
                    ((png_image_read_control *)argument,pVar19,local_90,local_90,local_90,0,iVar8);
          local_90 = pVar19;
        }
        else if (uVar7 != 0) {
          uVar14 = local_90 * 0xff >> 0xf;
          pVar19 = ((uint)png_sRGB_delta[uVar14] * (local_90 * 0xff & 0x7fff) >> 0xc) +
                   (uint)png_sRGB_base[uVar14] >> 8 & 0xff;
          iVar8 = 2;
          goto LAB_0010cc80;
        }
        c.index = '\0';
        auVar28 = pshuflw(ZEXT416(local_90),ZEXT416(local_90),0);
        c._2_8_ = auVar28._0_8_;
        lVar18 = 0;
        png_set_background_fixed(png_ptr,&c,1,0,0);
        goto LAB_0010ceea;
      }
      lVar18 = 0;
    }
    else {
      lVar18 = 3;
      if ((bVar5 != 6) && (png_ptr->num_trans == 0)) {
        if (*(uint *)((long)puVar2 + 0x1c) < 0xd8) {
          pcVar20 = "rgb color-map: too few entries";
          goto LAB_0010d149;
        }
        pVar9 = make_rgb_colormap((png_image_read_control *)argument);
        break;
      }
      if ((uVar14 & 1) == 0) {
        if (*(uint *)((long)puVar2 + 0x1c) < 0xf4) {
          pcVar20 = "rgb-alpha color-map: too few entries";
          goto LAB_0010d149;
        }
        __n = (ulong)(uVar7 >> 2) * 3 + 3;
        pVar9 = make_rgb_colormap((png_image_read_control *)argument);
        png_create_colormap_entry
                  ((png_image_read_control *)argument,pVar9,local_98,local_90,uVar16,0,iVar8);
        pVar19 = local_98;
        pVar13 = local_90;
        pVar23 = local_90;
        if (uVar7 != 0) {
          uVar14 = local_98 * 0xff >> 0xf;
          pVar19 = ((uint)png_sRGB_delta[uVar14] * (local_98 * 0xff & 0x7fff) >> 0xc) +
                   (uint)png_sRGB_base[uVar14] >> 8 & 0xff;
          uVar14 = local_90 * 0xff >> 0xf;
          pVar13 = ((uint)png_sRGB_delta[uVar14] * (local_90 * 0xff & 0x7fff) >> 0xc) +
                   (uint)png_sRGB_base[uVar14] >> 8 & 0xff;
          uVar14 = uVar16 * 0xff >> 0xf;
          pVar23 = ((uint)png_sRGB_delta[uVar14] * (uVar16 * 0xff & 0x7fff) >> 0xc) +
                   (uint)png_sRGB_base[uVar14] >> 8 & 0xff;
        }
        iVar11 = (int)__n;
        iVar11 = bcmp((void *)((ulong)(pVar9 * iVar11) + *(long *)((long)argument + 0x18)),
                      (void *)((ulong)(((pVar23 * 5 + 0x82 >> 8) +
                                        ((pVar13 * 5 + 0x82 >> 8) + (pVar19 * 5 + 0x82 >> 8) * 6) *
                                        6 & 0xff) * iVar11) + *(long *)((long)argument + 0x18)),__n)
        ;
        if (iVar11 == 0) {
          c.index = '\0';
          c.green = (png_uint_16)uVar26;
          c.red = (png_uint_16)local_98;
          c.blue = (png_uint_16)uVar16;
          c.gray = (png_uint_16)uVar26;
          png_set_background_fixed(png_ptr,&c,1,0,0);
          lVar18 = 3;
          break;
        }
        pVar9 = pVar9 + 1;
        for (uVar14 = 0; local_80 = 1, uVar14 < 0x100; uVar14 = uVar14 * 2 | 0x7f) {
          for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 * 2 | 0x7f) {
            for (uVar24 = 0; uVar24 < 0x100; uVar24 = uVar24 * 2 | 0x7f) {
              pVar19 = png_colormap_compose
                                 ((png_image_read_control *)argument,uVar14,1,0x80,local_98,iVar8);
              pVar13 = png_colormap_compose
                                 ((png_image_read_control *)argument,uVar7,1,0x80,local_90,iVar8);
              pVar23 = png_colormap_compose
                                 ((png_image_read_control *)argument,uVar24,1,0x80,uVar16,iVar8);
              png_create_colormap_entry
                        ((png_image_read_control *)argument,pVar9,pVar19,pVar13,pVar23,0,iVar8);
              pVar9 = pVar9 + 1;
            }
          }
        }
        lVar18 = 4;
      }
      else {
        if (*(uint *)((long)puVar2 + 0x1c) < 0xf4) {
          pcVar20 = "rgb+alpha color-map: too few entries";
          goto LAB_0010d1cd;
        }
        pVar9 = make_rgb_colormap((png_image_read_control *)argument);
        png_create_colormap_entry((png_image_read_control *)argument,pVar9,0xff,0xff,0xff,0,1);
        pVar9 = pVar9 + 1;
        lVar18 = 4;
        for (uVar14 = 0; uVar14 < 0x100; uVar14 = uVar14 * 2 | 0x7f) {
          for (uVar7 = 0; uVar7 < 0x100; uVar7 = uVar7 * 2 | 0x7f) {
            for (uVar16 = 0; uVar16 < 0x100; uVar16 = uVar16 * 2 | 0x7f) {
              png_create_colormap_entry
                        ((png_image_read_control *)argument,pVar9,uVar14,uVar7,uVar16,0x80,1);
              pVar9 = pVar9 + 1;
            }
          }
        }
        local_80 = 1;
      }
LAB_0010ceea:
      if ((png_ptr->num_trans != 0) && ((png_ptr->color_type & 4) == 0)) {
        png_set_tRNS_to_alpha(png_ptr);
      }
    }
    if (local_80 != 3) {
      if (local_80 != 1) {
        pcVar20 = "bad data option (internal error)";
        goto LAB_0010d149;
      }
      break;
    }
    goto LAB_0010cf29;
  case 3:
    uVar26 = (ulong)png_ptr->num_trans;
    if (uVar26 == 0) {
      ppVar27 = (png_bytep)0x0;
    }
    else {
      ppVar27 = png_ptr->trans_alpha;
    }
    uVar24 = 0x100;
    if ((ushort)*(uint *)&png_ptr->num_palette < 0x100) {
      uVar24 = *(uint *)&png_ptr->num_palette;
    }
    pVar9 = uVar24 & 0xffff;
    if (*(uint *)((long)puVar2 + 0x1c) < pVar9) {
      pcVar20 = "palette color-map: too few entries";
      goto LAB_0010d149;
    }
    ppVar25 = &png_ptr->palette->blue;
    for (uVar17 = 0; pVar9 != uVar17; uVar17 = uVar17 + 1) {
      if (((ppVar27 == (png_bytep)0x0 || (uVar14 & 1) != 0) || uVar17 >= uVar26) ||
         (bVar5 = ppVar27[uVar17], bVar5 == 0xff)) {
        pVar19 = 0xff;
        if (ppVar27 != (png_bytep)0x0 && uVar17 < uVar26) {
          pVar19 = (png_uint_32)ppVar27[uVar17];
        }
        pVar23 = (png_uint_32)((png_color *)(ppVar25 + -2))->red;
        pVar13 = (png_uint_32)ppVar25[-1];
        uVar24 = (uint)*ppVar25;
        iVar11 = 3;
      }
      else {
        iVar11 = iVar8;
        if (bVar5 == 0) {
          pVar13 = local_90;
          uVar24 = uVar16;
          pVar23 = local_98;
          pVar19 = 0;
        }
        else {
          pVar23 = png_colormap_compose
                             ((png_image_read_control *)argument,
                              (uint)((png_color *)(ppVar25 + -2))->red,3,(uint)bVar5,local_98,iVar8)
          ;
          pVar13 = png_colormap_compose
                             ((png_image_read_control *)argument,(uint)ppVar25[-1],3,
                              (uint)ppVar27[uVar17],local_90,iVar8);
          uVar24 = png_colormap_compose
                             ((png_image_read_control *)argument,(uint)*ppVar25,3,
                              (uint)ppVar27[uVar17],uVar16,iVar8);
          pVar19 = (uint)ppVar27[uVar17] * 0x101;
          if (uVar7 == 0) {
            pVar19 = (uint)ppVar27[uVar17];
          }
        }
      }
      png_create_colormap_entry
                ((png_image_read_control *)argument,(png_uint_32)uVar17,pVar23,pVar13,uVar24,pVar19,
                 iVar11);
      ppVar25 = ppVar25 + 3;
    }
    bVar5 = png_ptr->bit_depth;
    if (bVar5 < 8) goto LAB_0010cd75;
LAB_0010cd8f:
    lVar18 = 0;
    goto LAB_0010cf35;
  case 4:
    if ((uVar14 & 1) == 0) {
      if (((uVar14 & 2) == 0) || ((local_98 == local_90 && (local_90 == uVar16)))) {
        if (*(uint *)((long)puVar2 + 0x1c) < 0x100) {
          pcVar20 = "gray-alpha color-map: too few entries";
          goto LAB_0010d149;
        }
        pVar9 = make_gray_colormap((png_image_read_control *)argument);
        pVar19 = local_90;
        if (uVar7 != 0) {
          uVar14 = local_90 * 0xff >> 0xf;
          pVar19 = ((uint)png_sRGB_delta[uVar14] * (local_90 * 0xff & 0x7fff) >> 0xc) +
                   (uint)png_sRGB_base[uVar14] >> 8 & 0xff;
          png_create_colormap_entry
                    ((png_image_read_control *)argument,pVar19,local_90,local_90,local_90,0xffff,2);
        }
        c.index = '\0';
        auVar28 = pshuflw(ZEXT416(pVar19),ZEXT416(pVar19),0);
        c._2_8_ = auVar28._0_8_;
        lVar18 = 0;
        png_set_background_fixed(png_ptr,&c,1,0,0);
      }
      else {
        if (*(uint *)((long)puVar2 + 0x1c) < 0x100) {
          pcVar20 = "ga-alpha color-map: too few entries";
LAB_0010d1cd:
          png_error(png_ptr,pcVar20);
        }
        uVar14 = 0x73;
        for (pVar9 = 0; pVar9 != 0xe7; pVar9 = pVar9 + 1) {
          uVar24 = (uVar14 & 0xffff) / 0xe7;
          png_create_colormap_entry
                    ((png_image_read_control *)argument,pVar9,uVar24,uVar24,uVar24,0xff,1);
          uVar14 = uVar14 + 0x100;
        }
        pVar9 = 0xffff;
        if (uVar7 == 0) {
          pVar9 = 0xff;
        }
        png_create_colormap_entry
                  ((png_image_read_control *)argument,0xe7,local_98,local_90,uVar16,pVar9,iVar8);
        if (uVar7 == 0) {
          local_98 = (uint)png_sRGB_table[local_98];
          local_90 = (uint)png_sRGB_table[uVar26];
          uVar16 = (uint)png_sRGB_table[uVar16];
        }
        pVar9 = 0xe8;
        for (iVar8 = 1; lVar18 = 1, iVar8 != 5; iVar8 = iVar8 + 1) {
          iVar11 = iVar8 * -0x33 + 0xff;
          for (lVar18 = 0; lVar18 != 0x264; lVar18 = lVar18 + 0x66) {
            iVar12 = (uint)*(ushort *)((long)png_sRGB_table + lVar18) * iVar8 * 0x33;
            uVar7 = iVar11 * local_98 + iVar12;
            uVar15 = uVar7 >> 0xf;
            uVar22 = iVar12 + iVar11 * local_90;
            uVar24 = uVar22 >> 0xf;
            uVar14 = iVar12 + iVar11 * uVar16;
            uVar21 = uVar14 >> 0xf;
            png_create_colormap_entry
                      ((png_image_read_control *)argument,pVar9,
                       ((uint)png_sRGB_delta[uVar15] * (uVar7 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar15] >> 8 & 0xff,
                       ((uint)png_sRGB_delta[uVar24] * (uVar22 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar24] >> 8 & 0xff,
                       ((uint)png_sRGB_delta[uVar21] * (uVar14 & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar21] >> 8 & 0xff,0xff,1);
            pVar9 = pVar9 + 1;
          }
        }
      }
    }
    else {
      if (*(uint *)((long)puVar2 + 0x1c) < 0x100) {
        pcVar20 = "gray+alpha color-map: too few entries";
        goto LAB_0010d149;
      }
      pVar9 = make_ga_colormap((png_image_read_control *)argument);
      lVar18 = 1;
    }
  }
  png_set_alpha_mode_fixed(png_ptr,0,220000);
LAB_0010cf29:
  bVar5 = png_ptr->bit_depth;
LAB_0010cf35:
  if (8 < bVar5) {
    png_set_scale_16(png_ptr);
  }
  if ((pVar9 < 0x101) && (pVar9 <= *(uint *)((long)puVar2 + 0x1c))) {
    *(png_uint_32 *)((long)puVar2 + 0x1c) = pVar9;
    iVar8 = (*(code *)((long)&DAT_00120554 + (long)(int)(&DAT_00120554)[lVar18]))();
    return iVar8;
  }
  pcVar20 = "color map overflow (BAD internal error)";
LAB_0010d149:
  png_error(png_ptr,pcVar20);
}

Assistant:

static int
png_image_read_colormap(png_voidp argument)
{
   png_image_read_control *display =
      png_voidcast(png_image_read_control*, argument);
   png_imagep image = display->image;

   png_structrp png_ptr = image->opaque->png_ptr;
   png_uint_32 output_format = image->format;
   int output_encoding = (output_format & PNG_FORMAT_FLAG_LINEAR) != 0 ?
      P_LINEAR : P_sRGB;

   unsigned int cmap_entries;
   unsigned int output_processing;        /* Output processing option */
   unsigned int data_encoding = P_NOTSET; /* Encoding libpng must produce */

   /* Background information; the background color and the index of this color
    * in the color-map if it exists (else 256).
    */
   unsigned int background_index = 256;
   png_uint_32 back_r, back_g, back_b;

   /* Flags to accumulate things that need to be done to the input. */
   int expand_tRNS = 0;

   /* Exclude the NYI feature of compositing onto a color-mapped buffer; it is
    * very difficult to do, the results look awful, and it is difficult to see
    * what possible use it is because the application can't control the
    * color-map.
    */
   if (((png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0 ||
         png_ptr->num_trans > 0) /* alpha in input */ &&
      ((output_format & PNG_FORMAT_FLAG_ALPHA) == 0) /* no alpha in output */)
   {
      if (output_encoding == P_LINEAR) /* compose on black */
         back_b = back_g = back_r = 0;

      else if (display->background == NULL /* no way to remove it */)
         png_error(png_ptr,
             "background color must be supplied to remove alpha/transparency");

      /* Get a copy of the background color (this avoids repeating the checks
       * below.)  The encoding is 8-bit sRGB or 16-bit linear, depending on the
       * output format.
       */
      else
      {
         back_g = display->background->green;
         if ((output_format & PNG_FORMAT_FLAG_COLOR) != 0)
         {
            back_r = display->background->red;
            back_b = display->background->blue;
         }
         else
            back_b = back_r = back_g;
      }
   }

   else if (output_encoding == P_LINEAR)
      back_b = back_r = back_g = 65535;

   else
      back_b = back_r = back_g = 255;

   /* Default the input file gamma if required - this is necessary because
    * libpng assumes that if no gamma information is present the data is in the
    * output format, but the simplified API deduces the gamma from the input
    * format.  The 'default' gamma value is also set by png_set_alpha_mode, but
    * this is happening before any such call, so:
    *
    * TODO: should be an internal API and all this code should be copied into a
    * single common gamma+colorspace file.
    */
   if (png_ptr->bit_depth == 16 &&
      (image->flags & PNG_IMAGE_FLAG_16BIT_sRGB) == 0)
      png_ptr->default_gamma = PNG_GAMMA_LINEAR;

   else
      png_ptr->default_gamma = PNG_GAMMA_sRGB_INVERSE;

   /* Decide what to do based on the PNG color type of the input data.  The
    * utility function png_create_colormap_entry deals with most aspects of the
    * output transformations; this code works out how to produce bytes of
    * color-map entries from the original format.
    */
   switch (png_ptr->color_type)
   {
      case PNG_COLOR_TYPE_GRAY:
         if (png_ptr->bit_depth <= 8)
         {
            /* There at most 256 colors in the output, regardless of
             * transparency.
             */
            unsigned int step, i, val, trans = 256/*ignore*/, back_alpha = 0;

            cmap_entries = 1U << png_ptr->bit_depth;
            if (cmap_entries > image->colormap_entries)
               png_error(png_ptr, "gray[8] color-map: too few entries");

            step = 255 / (cmap_entries - 1);
            output_processing = PNG_CMAP_NONE;

            /* If there is a tRNS chunk then this either selects a transparent
             * value or, if the output has no alpha, the background color.
             */
            if (png_ptr->num_trans > 0)
            {
               trans = png_ptr->trans_color.gray;

               if ((output_format & PNG_FORMAT_FLAG_ALPHA) == 0)
                  back_alpha = output_encoding == P_LINEAR ? 65535 : 255;
            }

            /* png_create_colormap_entry just takes an RGBA and writes the
             * corresponding color-map entry using the format from 'image',
             * including the required conversion to sRGB or linear as
             * appropriate.  The input values are always either sRGB (if the
             * gamma correction flag is 0) or 0..255 scaled file encoded values
             * (if the function must gamma correct them).
             */
            for (i=val=0; i<cmap_entries; ++i, val += step)
            {
               /* 'i' is a file value.  While this will result in duplicated
                * entries for 8-bit non-sRGB encoded files it is necessary to
                * have non-gamma corrected values to do tRNS handling.
                */
               if (i != trans)
                  png_create_colormap_entry(display, i, val, val, val, 255,
                      P_FILE/*8-bit with file gamma*/);

               /* Else this entry is transparent.  The colors don't matter if
                * there is an alpha channel (back_alpha == 0), but it does no
                * harm to pass them in; the values are not set above so this
                * passes in white.
                *
                * NOTE: this preserves the full precision of the application
                * supplied background color when it is used.
                */
               else
                  png_create_colormap_entry(display, i, back_r, back_g, back_b,
                      back_alpha, output_encoding);
            }

            /* We need libpng to preserve the original encoding. */
            data_encoding = P_FILE;

            /* The rows from libpng, while technically gray values, are now also
             * color-map indices; however, they may need to be expanded to 1
             * byte per pixel.  This is what png_set_packing does (i.e., it
             * unpacks the bit values into bytes.)
             */
            if (png_ptr->bit_depth < 8)
               png_set_packing(png_ptr);
         }

         else /* bit depth is 16 */
         {
            /* The 16-bit input values can be converted directly to 8-bit gamma
             * encoded values; however, if a tRNS chunk is present 257 color-map
             * entries are required.  This means that the extra entry requires
             * special processing; add an alpha channel, sacrifice gray level
             * 254 and convert transparent (alpha==0) entries to that.
             *
             * Use libpng to chop the data to 8 bits.  Convert it to sRGB at the
             * same time to minimize quality loss.  If a tRNS chunk is present
             * this means libpng must handle it too; otherwise it is impossible
             * to do the exact match on the 16-bit value.
             *
             * If the output has no alpha channel *and* the background color is
             * gray then it is possible to let libpng handle the substitution by
             * ensuring that the corresponding gray level matches the background
             * color exactly.
             */
            data_encoding = P_sRGB;

            if (PNG_GRAY_COLORMAP_ENTRIES > image->colormap_entries)
               png_error(png_ptr, "gray[16] color-map: too few entries");

            cmap_entries = (unsigned int)make_gray_colormap(display);

            if (png_ptr->num_trans > 0)
            {
               unsigned int back_alpha;

               if ((output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
                  back_alpha = 0;

               else
               {
                  if (back_r == back_g && back_g == back_b)
                  {
                     /* Background is gray; no special processing will be
                      * required.
                      */
                     png_color_16 c;
                     png_uint_32 gray = back_g;

                     if (output_encoding == P_LINEAR)
                     {
                        gray = PNG_sRGB_FROM_LINEAR(gray * 255);

                        /* And make sure the corresponding palette entry
                         * matches.
                         */
                        png_create_colormap_entry(display, gray, back_g, back_g,
                            back_g, 65535, P_LINEAR);
                     }

                     /* The background passed to libpng, however, must be the
                      * sRGB value.
                      */
                     c.index = 0; /*unused*/
                     c.gray = c.red = c.green = c.blue = (png_uint_16)gray;

                     /* NOTE: does this work without expanding tRNS to alpha?
                      * It should be the color->gray case below apparently
                      * doesn't.
                      */
                     png_set_background_fixed(png_ptr, &c,
                         PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                         0/*gamma: not used*/);

                     output_processing = PNG_CMAP_NONE;
                     break;
                  }
#ifdef __COVERITY__
                 /* Coverity claims that output_encoding cannot be 2 (P_LINEAR)
                  * here.
                  */
                  back_alpha = 255;
#else
                  back_alpha = output_encoding == P_LINEAR ? 65535 : 255;
#endif
               }

               /* output_processing means that the libpng-processed row will be
                * 8-bit GA and it has to be processing to single byte color-map
                * values.  Entry 254 is replaced by either a completely
                * transparent entry or by the background color at full
                * precision (and the background color is not a simple gray
                * level in this case.)
                */
               expand_tRNS = 1;
               output_processing = PNG_CMAP_TRANS;
               background_index = 254;

               /* And set (overwrite) color-map entry 254 to the actual
                * background color at full precision.
                */
               png_create_colormap_entry(display, 254, back_r, back_g, back_b,
                   back_alpha, output_encoding);
            }

            else
               output_processing = PNG_CMAP_NONE;
         }
         break;

      case PNG_COLOR_TYPE_GRAY_ALPHA:
         /* 8-bit or 16-bit PNG with two channels - gray and alpha.  A minimum
          * of 65536 combinations.  If, however, the alpha channel is to be
          * removed there are only 256 possibilities if the background is gray.
          * (Otherwise there is a subset of the 65536 possibilities defined by
          * the triangle between black, white and the background color.)
          *
          * Reduce 16-bit files to 8-bit and sRGB encode the result.  No need to
          * worry about tRNS matching - tRNS is ignored if there is an alpha
          * channel.
          */
         data_encoding = P_sRGB;

         if ((output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
         {
            if (PNG_GA_COLORMAP_ENTRIES > image->colormap_entries)
               png_error(png_ptr, "gray+alpha color-map: too few entries");

            cmap_entries = (unsigned int)make_ga_colormap(display);

            background_index = PNG_CMAP_GA_BACKGROUND;
            output_processing = PNG_CMAP_GA;
         }

         else /* alpha is removed */
         {
            /* Alpha must be removed as the PNG data is processed when the
             * background is a color because the G and A channels are
             * independent and the vector addition (non-parallel vectors) is a
             * 2-D problem.
             *
             * This can be reduced to the same algorithm as above by making a
             * colormap containing gray levels (for the opaque grays), a
             * background entry (for a transparent pixel) and a set of four six
             * level color values, one set for each intermediate alpha value.
             * See the comments in make_ga_colormap for how this works in the
             * per-pixel processing.
             *
             * If the background is gray, however, we only need a 256 entry gray
             * level color map.  It is sufficient to make the entry generated
             * for the background color be exactly the color specified.
             */
            if ((output_format & PNG_FORMAT_FLAG_COLOR) == 0 ||
               (back_r == back_g && back_g == back_b))
            {
               /* Background is gray; no special processing will be required. */
               png_color_16 c;
               png_uint_32 gray = back_g;

               if (PNG_GRAY_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "gray-alpha color-map: too few entries");

               cmap_entries = (unsigned int)make_gray_colormap(display);

               if (output_encoding == P_LINEAR)
               {
                  gray = PNG_sRGB_FROM_LINEAR(gray * 255);

                  /* And make sure the corresponding palette entry matches. */
                  png_create_colormap_entry(display, gray, back_g, back_g,
                      back_g, 65535, P_LINEAR);
               }

               /* The background passed to libpng, however, must be the sRGB
                * value.
                */
               c.index = 0; /*unused*/
               c.gray = c.red = c.green = c.blue = (png_uint_16)gray;

               png_set_background_fixed(png_ptr, &c,
                   PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                   0/*gamma: not used*/);

               output_processing = PNG_CMAP_NONE;
            }

            else
            {
               png_uint_32 i, a;

               /* This is the same as png_make_ga_colormap, above, except that
                * the entries are all opaque.
                */
               if (PNG_GA_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "ga-alpha color-map: too few entries");

               i = 0;
               while (i < 231)
               {
                  png_uint_32 gray = (i * 256 + 115) / 231;
                  png_create_colormap_entry(display, i++, gray, gray, gray,
                      255, P_sRGB);
               }

               /* NOTE: this preserves the full precision of the application
                * background color.
                */
               background_index = i;
               png_create_colormap_entry(display, i++, back_r, back_g, back_b,
#ifdef __COVERITY__
                   /* Coverity claims that output_encoding
                    * cannot be 2 (P_LINEAR) here.
                    */ 255U,
#else
                    output_encoding == P_LINEAR ? 65535U : 255U,
#endif
                    output_encoding);

               /* For non-opaque input composite on the sRGB background - this
                * requires inverting the encoding for each component.  The input
                * is still converted to the sRGB encoding because this is a
                * reasonable approximate to the logarithmic curve of human
                * visual sensitivity, at least over the narrow range which PNG
                * represents.  Consequently 'G' is always sRGB encoded, while
                * 'A' is linear.  We need the linear background colors.
                */
               if (output_encoding == P_sRGB) /* else already linear */
               {
                  /* This may produce a value not exactly matching the
                   * background, but that's ok because these numbers are only
                   * used when alpha != 0
                   */
                  back_r = png_sRGB_table[back_r];
                  back_g = png_sRGB_table[back_g];
                  back_b = png_sRGB_table[back_b];
               }

               for (a=1; a<5; ++a)
               {
                  unsigned int g;

                  /* PNG_sRGB_FROM_LINEAR expects a 16-bit linear value scaled
                   * by an 8-bit alpha value (0..255).
                   */
                  png_uint_32 alpha = 51 * a;
                  png_uint_32 back_rx = (255-alpha) * back_r;
                  png_uint_32 back_gx = (255-alpha) * back_g;
                  png_uint_32 back_bx = (255-alpha) * back_b;

                  for (g=0; g<6; ++g)
                  {
                     png_uint_32 gray = png_sRGB_table[g*51] * alpha;

                     png_create_colormap_entry(display, i++,
                         PNG_sRGB_FROM_LINEAR(gray + back_rx),
                         PNG_sRGB_FROM_LINEAR(gray + back_gx),
                         PNG_sRGB_FROM_LINEAR(gray + back_bx), 255, P_sRGB);
                  }
               }

               cmap_entries = i;
               output_processing = PNG_CMAP_GA;
            }
         }
         break;

      case PNG_COLOR_TYPE_RGB:
      case PNG_COLOR_TYPE_RGB_ALPHA:
         /* Exclude the case where the output is gray; we can always handle this
          * with the cases above.
          */
         if ((output_format & PNG_FORMAT_FLAG_COLOR) == 0)
         {
            /* The color-map will be grayscale, so we may as well convert the
             * input RGB values to a simple grayscale and use the grayscale
             * code above.
             *
             * NOTE: calling this apparently damages the recognition of the
             * transparent color in background color handling; call
             * png_set_tRNS_to_alpha before png_set_background_fixed.
             */
            png_set_rgb_to_gray_fixed(png_ptr, PNG_ERROR_ACTION_NONE, -1,
                -1);
            data_encoding = P_sRGB;

            /* The output will now be one or two 8-bit gray or gray+alpha
             * channels.  The more complex case arises when the input has alpha.
             */
            if ((png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
               png_ptr->num_trans > 0) &&
               (output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
            {
               /* Both input and output have an alpha channel, so no background
                * processing is required; just map the GA bytes to the right
                * color-map entry.
                */
               expand_tRNS = 1;

               if (PNG_GA_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "rgb[ga] color-map: too few entries");

               cmap_entries = (unsigned int)make_ga_colormap(display);
               background_index = PNG_CMAP_GA_BACKGROUND;
               output_processing = PNG_CMAP_GA;
            }

            else
            {
               const png_fixed_point gamma = png_resolve_file_gamma(png_ptr);

               /* Either the input or the output has no alpha channel, so there
                * will be no non-opaque pixels in the color-map; it will just be
                * grayscale.
                */
               if (PNG_GRAY_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "rgb[gray] color-map: too few entries");

               /* Ideally this code would use libpng to do the gamma correction,
                * but if an input alpha channel is to be removed we will hit the
                * libpng bug in gamma+compose+rgb-to-gray (the double gamma
                * correction bug).  Fix this by dropping the gamma correction in
                * this case and doing it in the palette; this will result in
                * duplicate palette entries, but that's better than the
                * alternative of double gamma correction.
                *
                * NOTE: PNGv3: check the resolved result of all the potentially
                * different colour space chunks.
                */
               if ((png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
                  png_ptr->num_trans > 0) &&
                  png_gamma_not_sRGB(gamma) != 0)
               {
                  cmap_entries = (unsigned int)make_gray_file_colormap(display);
                  data_encoding = P_FILE;
               }

               else
                  cmap_entries = (unsigned int)make_gray_colormap(display);

               /* But if the input has alpha or transparency it must be removed
                */
               if (png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
                  png_ptr->num_trans > 0)
               {
                  png_color_16 c;
                  png_uint_32 gray = back_g;

                  /* We need to ensure that the application background exists in
                   * the colormap and that completely transparent pixels map to
                   * it.  Achieve this simply by ensuring that the entry
                   * selected for the background really is the background color.
                   */
                  if (data_encoding == P_FILE) /* from the fixup above */
                  {
                     /* The app supplied a gray which is in output_encoding, we
                      * need to convert it to a value of the input (P_FILE)
                      * encoding then set this palette entry to the required
                      * output encoding.
                      */
                     if (output_encoding == P_sRGB)
                        gray = png_sRGB_table[gray]; /* now P_LINEAR */

                     gray = PNG_DIV257(png_gamma_16bit_correct(gray, gamma));
                        /* now P_FILE */

                     /* And make sure the corresponding palette entry contains
                      * exactly the required sRGB value.
                      */
                     png_create_colormap_entry(display, gray, back_g, back_g,
                         back_g, 0/*unused*/, output_encoding);
                  }

                  else if (output_encoding == P_LINEAR)
                  {
                     gray = PNG_sRGB_FROM_LINEAR(gray * 255);

                     /* And make sure the corresponding palette entry matches.
                      */
                     png_create_colormap_entry(display, gray, back_g, back_g,
                        back_g, 0/*unused*/, P_LINEAR);
                  }

                  /* The background passed to libpng, however, must be the
                   * output (normally sRGB) value.
                   */
                  c.index = 0; /*unused*/
                  c.gray = c.red = c.green = c.blue = (png_uint_16)gray;

                  /* NOTE: the following is apparently a bug in libpng. Without
                   * it the transparent color recognition in
                   * png_set_background_fixed seems to go wrong.
                   */
                  expand_tRNS = 1;
                  png_set_background_fixed(png_ptr, &c,
                      PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                      0/*gamma: not used*/);
               }

               output_processing = PNG_CMAP_NONE;
            }
         }

         else /* output is color */
         {
            /* We could use png_quantize here so long as there is no transparent
             * color or alpha; png_quantize ignores alpha.  Easier overall just
             * to do it once and using PNG_DIV51 on the 6x6x6 reduced RGB cube.
             * Consequently we always want libpng to produce sRGB data.
             */
            data_encoding = P_sRGB;

            /* Is there any transparency or alpha? */
            if (png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
               png_ptr->num_trans > 0)
            {
               /* Is there alpha in the output too?  If so all four channels are
                * processed into a special RGB cube with alpha support.
                */
               if ((output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
               {
                  png_uint_32 r;

                  if (PNG_RGB_COLORMAP_ENTRIES+1+27 > image->colormap_entries)
                     png_error(png_ptr, "rgb+alpha color-map: too few entries");

                  cmap_entries = (unsigned int)make_rgb_colormap(display);

                  /* Add a transparent entry. */
                  png_create_colormap_entry(display, cmap_entries, 255, 255,
                      255, 0, P_sRGB);

                  /* This is stored as the background index for the processing
                   * algorithm.
                   */
                  background_index = cmap_entries++;

                  /* Add 27 r,g,b entries each with alpha 0.5. */
                  for (r=0; r<256; r = (r << 1) | 0x7f)
                  {
                     png_uint_32 g;

                     for (g=0; g<256; g = (g << 1) | 0x7f)
                     {
                        png_uint_32 b;

                        /* This generates components with the values 0, 127 and
                         * 255
                         */
                        for (b=0; b<256; b = (b << 1) | 0x7f)
                           png_create_colormap_entry(display, cmap_entries++,
                               r, g, b, 128, P_sRGB);
                     }
                  }

                  expand_tRNS = 1;
                  output_processing = PNG_CMAP_RGB_ALPHA;
               }

               else
               {
                  /* Alpha/transparency must be removed.  The background must
                   * exist in the color map (achieved by setting adding it after
                   * the 666 color-map).  If the standard processing code will
                   * pick up this entry automatically that's all that is
                   * required; libpng can be called to do the background
                   * processing.
                   */
                  unsigned int sample_size =
                     PNG_IMAGE_SAMPLE_SIZE(output_format);
                  png_uint_32 r, g, b; /* sRGB background */

                  if (PNG_RGB_COLORMAP_ENTRIES+1+27 > image->colormap_entries)
                     png_error(png_ptr, "rgb-alpha color-map: too few entries");

                  cmap_entries = (unsigned int)make_rgb_colormap(display);

                  png_create_colormap_entry(display, cmap_entries, back_r,
                      back_g, back_b, 0/*unused*/, output_encoding);

                  if (output_encoding == P_LINEAR)
                  {
                     r = PNG_sRGB_FROM_LINEAR(back_r * 255);
                     g = PNG_sRGB_FROM_LINEAR(back_g * 255);
                     b = PNG_sRGB_FROM_LINEAR(back_b * 255);
                  }

                  else
                  {
                     r = back_r;
                     g = back_g;
                     b = back_g;
                  }

                  /* Compare the newly-created color-map entry with the one the
                   * PNG_CMAP_RGB algorithm will use.  If the two entries don't
                   * match, add the new one and set this as the background
                   * index.
                   */
                  if (memcmp((png_const_bytep)display->colormap +
                      sample_size * cmap_entries,
                      (png_const_bytep)display->colormap +
                          sample_size * PNG_RGB_INDEX(r,g,b),
                     sample_size) != 0)
                  {
                     /* The background color must be added. */
                     background_index = cmap_entries++;

                     /* Add 27 r,g,b entries each with created by composing with
                      * the background at alpha 0.5.
                      */
                     for (r=0; r<256; r = (r << 1) | 0x7f)
                     {
                        for (g=0; g<256; g = (g << 1) | 0x7f)
                        {
                           /* This generates components with the values 0, 127
                            * and 255
                            */
                           for (b=0; b<256; b = (b << 1) | 0x7f)
                              png_create_colormap_entry(display, cmap_entries++,
                                  png_colormap_compose(display, r, P_sRGB, 128,
                                      back_r, output_encoding),
                                  png_colormap_compose(display, g, P_sRGB, 128,
                                      back_g, output_encoding),
                                  png_colormap_compose(display, b, P_sRGB, 128,
                                      back_b, output_encoding),
                                  0/*unused*/, output_encoding);
                        }
                     }

                     expand_tRNS = 1;
                     output_processing = PNG_CMAP_RGB_ALPHA;
                  }

                  else /* background color is in the standard color-map */
                  {
                     png_color_16 c;

                     c.index = 0; /*unused*/
                     c.red = (png_uint_16)back_r;
                     c.gray = c.green = (png_uint_16)back_g;
                     c.blue = (png_uint_16)back_b;

                     png_set_background_fixed(png_ptr, &c,
                         PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                         0/*gamma: not used*/);

                     output_processing = PNG_CMAP_RGB;
                  }
               }
            }

            else /* no alpha or transparency in the input */
            {
               /* Alpha in the output is irrelevant, simply map the opaque input
                * pixels to the 6x6x6 color-map.
                */
               if (PNG_RGB_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "rgb color-map: too few entries");

               cmap_entries = (unsigned int)make_rgb_colormap(display);
               output_processing = PNG_CMAP_RGB;
            }
         }
         break;

      case PNG_COLOR_TYPE_PALETTE:
         /* It's already got a color-map.  It may be necessary to eliminate the
          * tRNS entries though.
          */
         {
            unsigned int num_trans = png_ptr->num_trans;
            png_const_bytep trans = num_trans > 0 ? png_ptr->trans_alpha : NULL;
            png_const_colorp colormap = png_ptr->palette;
            int do_background = trans != NULL &&
               (output_format & PNG_FORMAT_FLAG_ALPHA) == 0;
            unsigned int i;

            /* Just in case: */
            if (trans == NULL)
               num_trans = 0;

            output_processing = PNG_CMAP_NONE;
            data_encoding = P_FILE; /* Don't change from color-map indices */
            cmap_entries = (unsigned int)png_ptr->num_palette;
            if (cmap_entries > 256)
               cmap_entries = 256;

            if (cmap_entries > (unsigned int)image->colormap_entries)
               png_error(png_ptr, "palette color-map: too few entries");

            for (i=0; i < cmap_entries; ++i)
            {
               if (do_background != 0 && i < num_trans && trans[i] < 255)
               {
                  if (trans[i] == 0)
                     png_create_colormap_entry(display, i, back_r, back_g,
                         back_b, 0, output_encoding);

                  else
                  {
                     /* Must compose the PNG file color in the color-map entry
                      * on the sRGB color in 'back'.
                      */
                     png_create_colormap_entry(display, i,
                         png_colormap_compose(display, colormap[i].red,
                             P_FILE, trans[i], back_r, output_encoding),
                         png_colormap_compose(display, colormap[i].green,
                             P_FILE, trans[i], back_g, output_encoding),
                         png_colormap_compose(display, colormap[i].blue,
                             P_FILE, trans[i], back_b, output_encoding),
                         output_encoding == P_LINEAR ? trans[i] * 257U :
                             trans[i],
                         output_encoding);
                  }
               }

               else
                  png_create_colormap_entry(display, i, colormap[i].red,
                      colormap[i].green, colormap[i].blue,
                      i < num_trans ? trans[i] : 255U, P_FILE/*8-bit*/);
            }

            /* The PNG data may have indices packed in fewer than 8 bits, it
             * must be expanded if so.
             */
            if (png_ptr->bit_depth < 8)
               png_set_packing(png_ptr);
         }
         break;

      default:
         png_error(png_ptr, "invalid PNG color type");
         /*NOT REACHED*/
   }

   /* Now deal with the output processing */
   if (expand_tRNS != 0 && png_ptr->num_trans > 0 &&
       (png_ptr->color_type & PNG_COLOR_MASK_ALPHA) == 0)
      png_set_tRNS_to_alpha(png_ptr);

   switch (data_encoding)
   {
      case P_sRGB:
         /* Change to 8-bit sRGB */
         png_set_alpha_mode_fixed(png_ptr, PNG_ALPHA_PNG, PNG_GAMMA_sRGB);
         /* FALLTHROUGH */

      case P_FILE:
         if (png_ptr->bit_depth > 8)
            png_set_scale_16(png_ptr);
         break;

#ifdef __GNUC__
      default:
         png_error(png_ptr, "bad data option (internal error)");
#endif
   }

   if (cmap_entries > 256 || cmap_entries > image->colormap_entries)
      png_error(png_ptr, "color map overflow (BAD internal error)");

   image->colormap_entries = cmap_entries;

   /* Double check using the recorded background index */
   switch (output_processing)
   {
      case PNG_CMAP_NONE:
         if (background_index != PNG_CMAP_NONE_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_GA:
         if (background_index != PNG_CMAP_GA_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_TRANS:
         if (background_index >= cmap_entries ||
            background_index != PNG_CMAP_TRANS_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_RGB:
         if (background_index != PNG_CMAP_RGB_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_RGB_ALPHA:
         if (background_index != PNG_CMAP_RGB_ALPHA_BACKGROUND)
            goto bad_background;
         break;

      default:
         png_error(png_ptr, "bad processing option (internal error)");

      bad_background:
         png_error(png_ptr, "bad background index (internal error)");
   }

   display->colormap_processing = (int)output_processing;

   return 1/*ok*/;
}